

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void cmTargetCheckIMPORTED_GLOBAL(cmTarget *target,cmMakefile *context)

{
  bool bVar1;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> *__x;
  ostream *poVar2;
  string *psVar3;
  string local_200;
  undefined1 local_1e0 [8];
  ostringstream e;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_68 [3]
  ;
  cmTarget **local_50;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_48;
  __normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_> local_40;
  __normal_iterator<cmTarget_*const_*,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
  local_38;
  const_iterator it;
  vector<cmTarget_*,_std::allocator<cmTarget_*>_> targets;
  cmMakefile *context_local;
  cmTarget *target_local;
  
  context_local = (cmMakefile *)target;
  __x = cmMakefile::GetOwnedImportedTargets(context);
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&it,__x);
  local_48._M_current =
       (cmTarget **)
       std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::begin
                 ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&it);
  local_50 = (cmTarget **)
             std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                       ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&it);
  local_40 = std::
             find<__gnu_cxx::__normal_iterator<cmTarget**,std::vector<cmTarget*,std::allocator<cmTarget*>>>,cmTarget_const*>
                       (local_48,(__normal_iterator<cmTarget_**,_std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>_>
                                  )local_50,(cmTarget **)&context_local);
  __gnu_cxx::__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>>::
  __normal_iterator<cmTarget**>
            ((__normal_iterator<cmTarget*const*,std::vector<cmTarget*,std::allocator<cmTarget*>>> *)
             &local_38,&local_40);
  local_68[0]._M_current =
       (cmTarget **)
       std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::end
                 ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&it);
  bVar1 = __gnu_cxx::operator==(&local_38,local_68);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e0);
    poVar2 = std::operator<<((ostream *)local_1e0,"Attempt to promote imported target \"");
    psVar3 = cmTarget::GetName_abi_cxx11_((cmTarget *)context_local);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,
                    "\" to global scope (by setting IMPORTED_GLOBAL) which is not built in this directory."
                   );
    std::__cxx11::ostringstream::str();
    cmMakefile::IssueMessage(context,FATAL_ERROR,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e0);
  }
  std::vector<cmTarget_*,_std::allocator<cmTarget_*>_>::~vector
            ((vector<cmTarget_*,_std::allocator<cmTarget_*>_> *)&it);
  return;
}

Assistant:

static void cmTargetCheckIMPORTED_GLOBAL(const cmTarget* target,
                                         cmMakefile* context)
{
  std::vector<cmTarget*> targets = context->GetOwnedImportedTargets();
  std::vector<cmTarget*>::const_iterator it =
    std::find(targets.begin(), targets.end(), target);
  if (it == targets.end()) {
    std::ostringstream e;
    e << "Attempt to promote imported target \"" << target->GetName()
      << "\" to global scope (by setting IMPORTED_GLOBAL) "
         "which is not built in this directory.";
    context->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
}